

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assignment.cpp
# Opt level: O0

double sq_err(array<double,_5UL> *a1,array<double,_5UL> *a2)

{
  const_reference pvVar1;
  double e;
  size_t i;
  double se;
  size_type in_stack_ffffffffffffffc8;
  array<double,_5UL> *in_stack_ffffffffffffffd0;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0.0;
  for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
    pvVar1 = std::array<double,_5UL>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = (array<double,_5UL> *)*pvVar1;
    pvVar1 = std::array<double,_5UL>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_18 = ((double)in_stack_ffffffffffffffd0 - *pvVar1) *
               ((double)in_stack_ffffffffffffffd0 - *pvVar1) + local_18;
  }
  return local_18;
}

Assistant:

double sq_err(const std::array<double, test_len>& a1,
              const std::array<double, test_len>& a2) {
    double se {0};
    
    for (size_t i {0} ; i < test_len ; i++) {
        double e { a1[i] - a2[i] };
        se += e*e;
    }
    
    return se;
}